

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::uncheckedEnqueue(Solver *this,Lit p,CRef from)

{
  lbool lVar1;
  bool bVar2;
  undefined4 in_EAX;
  lbool *plVar3;
  VarData *pVVar4;
  VarData VVar5;
  undefined4 uStack_28;
  Lit local_24;
  
  _uStack_28 = CONCAT44(p.x,in_EAX);
  lVar1 = value(this,p);
  uStack_28 = CONCAT13(lVar1.value,(undefined3)uStack_28);
  bVar2 = lbool::operator==((lbool *)((long)&uStack_28 + 3),l_Undef);
  if (bVar2) {
    plVar3 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->assigns).
                         super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,p.x >> 1);
    plVar3->value = (byte)p.x & 1;
    VVar5.level = (this->trail_lim).sz;
    VVar5.reason = from;
    pVVar4 = IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->vardata).
                         super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>,
                        p.x >> 1);
    *pVVar4 = VVar5;
    vec<Minisat::Lit,_int>::push_(&this->trail,&local_24);
    return;
  }
  __assert_fail("value(p) == l_Undef",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                ,0x1e8,"void Minisat::Solver::uncheckedEnqueue(Lit, CRef)");
}

Assistant:

void Solver::uncheckedEnqueue(Lit p, CRef from)
{
    assert(value(p) == l_Undef);
    assigns[var(p)] = lbool(!sign(p));
    vardata[var(p)] = mkVarData(from, decisionLevel());
    trail.push_(p);
}